

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

void CB_EXPLORE::predict_or_learn_bag<false>(cb_explore *data,single_learner *base,example *ec)

{
  unkuint9 Var1;
  ulong uVar2;
  uint32_t i;
  uint uVar3;
  size_t i_1;
  ulong i_00;
  action_scores probs;
  action_score local_68;
  polyprediction *local_60;
  v_array<ACTION_SCORE::action_score> local_58;
  
  local_60 = &ec->pred;
  local_58._begin = (action_score *)(ec->pred).scalars._begin;
  local_58._end = (action_score *)(ec->pred).scalars._end;
  local_58.end_array = (action_score *)(ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  v_array<ACTION_SCORE::action_score>::clear(&local_58);
  for (uVar3 = 0; uVar3 < (data->cbcs).num_actions; uVar3 = uVar3 + 1) {
    local_68.score = 0.0;
    local_68.action = uVar3;
    v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_68);
  }
  uVar2 = data->bag_size;
  Var1 = (unkuint9)uVar2;
  for (i_00 = 0; i_00 < uVar2; i_00 = i_00 + 1) {
    BS::weight_gen(data->all);
    LEARNER::learner<char,_example>::predict(base,ec,i_00);
    uVar3 = (ec->pred).multiclass - 1;
    local_58._begin[uVar3].score = local_58._begin[uVar3].score + 1.0 / (float)(unkint9)Var1;
    uVar2 = data->bag_size;
  }
  (local_60->scalars).end_array = (float *)local_58.end_array;
  (local_60->scalars).erase_count = local_58.erase_count;
  (local_60->a_s)._begin = local_58._begin;
  (local_60->scalars)._end = (float *)local_58._end;
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  action_scores probs = ec.pred.a_s;
  probs.clear();

  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});
  float prob = 1.f / (float)data.bag_size;
  for (size_t i = 0; i < data.bag_size; i++)
  {
    uint32_t count = BS::weight_gen(*data.all);
    if (is_learn && count > 0)
      base.learn(ec, i);
    else
      base.predict(ec, i);
    uint32_t chosen = ec.pred.multiclass - 1;
    probs[chosen].score += prob;
    if (is_learn)
      for (uint32_t j = 1; j < count; j++) base.learn(ec, i);
  }

  ec.pred.a_s = probs;
}